

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# determinization.cc
# Opt level: O1

void __thiscall re2c::dfa_t::dfa_t(dfa_t *this,nfa_t *nfa,charset_t *charset,rules_t *rules)

{
  pointer *pppdVar1;
  vector<re2c::nfa_state_t*,std::allocator<re2c::nfa_state_t*>> *pvVar2;
  int iVar3;
  iterator __position;
  int *piVar4;
  iterator __position_00;
  dfa_state_t *pdVar5;
  RuleOp *pRVar6;
  map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
  *this_00;
  long lVar7;
  dfa_t *pdVar8;
  long lVar9;
  bool bVar10;
  uint uVar11;
  nfa_state_t **end;
  _Rb_tree<re2c::RuleOp*,re2c::RuleOp*,std::_Identity<re2c::RuleOp*>,std::less<re2c::RuleOp*>,std::allocator<re2c::RuleOp*>>
  *this_01;
  size_t *psVar12;
  nfa_state_t **ppnVar13;
  size_t sVar14;
  mapped_type *pmVar15;
  _Rb_tree_node_base *p_Var16;
  mapped_type *pmVar17;
  pointer *pppnVar18;
  long lVar19;
  elem_t *peVar20;
  ulong uVar21;
  size_type __n;
  long lVar22;
  long lVar23;
  ulong uVar24;
  pointer ppnVar25;
  long *plVar26;
  _Rb_tree_header *p_Var27;
  dfa_state_t *s;
  nfa_state_t *m;
  vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
  arcs;
  ord_hash_set_t kernels;
  map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
  s2rules;
  key_type_conflict local_100;
  dfa_t *local_f8;
  nfa_state_t **local_f0;
  dfa_state_t *local_e8;
  ulong local_e0;
  nfa_state_t *local_d8;
  vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
  local_d0;
  map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
  *local_b8;
  elem_t *local_b0;
  ord_hash_set_t local_a8;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
  local_60;
  
  (this->states).super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->states).super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->states).super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = ((long)(charset->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(charset->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start >> 2) - 1;
  this->nchars = __n;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8.lookup._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8.lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.lookup._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a8.lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.elems.
  super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.lookup._M_t._M_impl._0_8_ = 0;
  local_a8.elems.
  super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.elems.
  super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.lookup._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8 = this;
  local_a8.lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8.lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  local_f0 = (nfa_state_t **)operator_new__((ulong)nfa->size << 3);
  std::
  vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
  ::vector(&local_d0,__n,(allocator_type *)&local_100);
  ppnVar13 = local_f0;
  end = closure(local_f0,nfa->root);
  find_state(ppnVar13,end,&local_a8);
  local_100 = 0;
  local_b8 = rules;
  if (local_a8.elems.
      super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_a8.elems.
      super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      local_e8 = (dfa_state_t *)operator_new(0x18);
      local_e8->arcs = (size_t *)0x0;
      local_e8->rule = (RuleOp *)0x0;
      local_e8->ctx = false;
      __position._M_current =
           (local_f8->states).
           super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (local_f8->states).
          super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<re2c::dfa_state_t*,std::allocator<re2c::dfa_state_t*>>::
        _M_realloc_insert<re2c::dfa_state_t*const&>
                  ((vector<re2c::dfa_state_t*,std::allocator<re2c::dfa_state_t*>> *)local_f8,
                   __position,&local_e8);
      }
      else {
        *__position._M_current = local_e8;
        pppdVar1 = &(local_f8->states).
                    super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppdVar1 = *pppdVar1 + 1;
      }
      peVar20 = local_a8.elems.
                super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
                ._M_impl.super__Vector_impl_data._M_start[local_100];
      local_e0 = peVar20->size;
      if (7 < local_e0) {
        local_e0 = local_e0 >> 3;
        uVar24 = 0;
        local_b0 = peVar20;
        do {
          piVar4 = *(int **)(peVar20->data + uVar24 * 8);
          iVar3 = *piVar4;
          if (iVar3 == 3) {
            this_01 = (_Rb_tree<re2c::RuleOp*,re2c::RuleOp*,std::_Identity<re2c::RuleOp*>,std::less<re2c::RuleOp*>,std::allocator<re2c::RuleOp*>>
                       *)std::
                         map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
                         ::operator[]((map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
                                       *)&local_60,&local_100);
            std::
            _Rb_tree<re2c::RuleOp*,re2c::RuleOp*,std::_Identity<re2c::RuleOp*>,std::less<re2c::RuleOp*>,std::allocator<re2c::RuleOp*>>
            ::_M_insert_unique<re2c::RuleOp*const&>(this_01,(RuleOp **)(piVar4 + 2));
          }
          else if (iVar3 == 2) {
            local_e8->ctx = true;
          }
          else if (iVar3 == 1) {
            local_d8 = *(nfa_state_t **)(piVar4 + 2);
            plVar26 = *(long **)(piVar4 + 4);
            peVar20 = local_b0;
            if (plVar26 != (long *)0x0) {
              lVar23 = 0;
              do {
                lVar9 = lVar23 * 0x18;
                lVar22 = lVar23 + -1;
                do {
                  lVar19 = lVar9;
                  lVar23 = lVar22 + 1;
                  lVar7 = lVar22 + 1;
                  lVar9 = lVar19 + 0x18;
                  lVar22 = lVar23;
                } while ((charset->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start[lVar7] != *(uint *)(plVar26 + 1));
                uVar11 = (charset->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start[lVar23];
                while (uVar11 != *(uint *)((long)plVar26 + 0xc)) {
                  pvVar2 = (vector<re2c::nfa_state_t*,std::allocator<re2c::nfa_state_t*>> *)
                           ((long)&((local_d0.
                                     super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start + lVar19);
                  __position_00._M_current =
                       *(nfa_state_t ***)
                        ((long)&((local_d0.
                                  super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>
                                )._M_impl.super__Vector_impl_data._M_finish + lVar19);
                  if (__position_00._M_current ==
                      *(nfa_state_t ***)
                       ((long)&((local_d0.
                                 super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>
                               )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar19)) {
                    std::vector<re2c::nfa_state_t*,std::allocator<re2c::nfa_state_t*>>::
                    _M_realloc_insert<re2c::nfa_state_t*const&>(pvVar2,__position_00,&local_d8);
                  }
                  else {
                    *__position_00._M_current = local_d8;
                    pvVar2 = pvVar2 + 8;
                    *(long *)pvVar2 = *(long *)pvVar2 + 8;
                  }
                  lVar9 = lVar23 + 1;
                  lVar23 = lVar23 + 1;
                  lVar19 = lVar19 + 0x18;
                  uVar11 = (charset->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_start[lVar9];
                }
                plVar26 = (long *)*plVar26;
                peVar20 = local_b0;
              } while (plVar26 != (long *)0x0);
            }
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != local_e0);
      }
      pdVar8 = local_f8;
      psVar12 = (size_t *)
                operator_new__(-(ulong)(local_f8->nchars >> 0x3d != 0) | local_f8->nchars << 3);
      local_e8->arcs = psVar12;
      uVar24 = pdVar8->nchars;
      if (uVar24 != 0) {
        uVar21 = 0;
        do {
          ppnVar13 = local_f0;
          for (ppnVar25 = local_d0.
                          super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar21].
                          super__Vector_base<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              ppnVar25 !=
              local_d0.
              super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar21].
              super__Vector_base<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>._M_impl.
              super__Vector_impl_data._M_finish; ppnVar25 = ppnVar25 + 1) {
            ppnVar13 = closure(ppnVar13,*ppnVar25);
          }
          sVar14 = find_state(local_f0,ppnVar13,&local_a8);
          local_e8->arcs[uVar21] = sVar14;
          uVar21 = uVar21 + 1;
          uVar24 = local_f8->nchars;
        } while (uVar21 < uVar24);
      }
      if (uVar24 != 0) {
        pppnVar18 = &((local_d0.
                       super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
        do {
          if (*pppnVar18 != ((_Vector_impl_data *)(pppnVar18 + -1))->_M_start) {
            *pppnVar18 = ((_Vector_impl_data *)(pppnVar18 + -1))->_M_start;
          }
          pppnVar18 = pppnVar18 + 3;
          uVar24 = uVar24 - 1;
        } while (uVar24 != 0);
      }
      local_100 = local_100 + 1;
    } while (local_100 <
             (ulong)((long)local_a8.elems.
                           super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_a8.elems.
                           super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  operator_delete__(local_f0);
  local_100 = 0;
  lVar23 = (long)(local_f8->states).
                 super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(local_f8->states).
                 super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar23 != 0) {
    do {
      pdVar5 = (local_f8->states).
               super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl
               .super__Vector_impl_data._M_start[local_100];
      pmVar15 = std::
                map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
                ::operator[]((map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
                              *)&local_60,&local_100);
      p_Var27 = &(pmVar15->_M_t)._M_impl.super__Rb_tree_header;
      p_Var16 = (pmVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      this_00 = local_b8;
      while (local_b8 = this_00, (_Rb_tree_header *)p_Var16 != p_Var27) {
        pRVar6 = *(RuleOp **)(p_Var16 + 1);
        if ((pdVar5->rule == (RuleOp *)0x0) ||
           (bVar10 = rule_rank_t::operator<(&pRVar6->rank,&pdVar5->rule->rank), bVar10)) {
          pdVar5->rule = pRVar6;
        }
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
        this_00 = local_b8;
      }
      for (p_Var16 = (pmVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var16 != p_Var27;
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
        if (pdVar5->rule != *(RuleOp **)(p_Var16 + 1)) {
          pmVar17 = std::
                    map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
                    ::operator[](this_00,&(*(RuleOp **)(p_Var16 + 1))->rank);
          std::
          _Rb_tree<re2c::rule_rank_t,re2c::rule_rank_t,std::_Identity<re2c::rule_rank_t>,std::less<re2c::rule_rank_t>,std::allocator<re2c::rule_rank_t>>
          ::_M_insert_unique<re2c::rule_rank_t_const&>
                    ((_Rb_tree<re2c::rule_rank_t,re2c::rule_rank_t,std::_Identity<re2c::rule_rank_t>,std::less<re2c::rule_rank_t>,std::allocator<re2c::rule_rank_t>>
                      *)&pmVar17->shadow,&pdVar5->rule->rank);
        }
      }
      local_100 = local_100 + 1;
    } while (local_100 < (ulong)(lVar23 >> 3));
  }
  std::
  vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
  ::~vector(&local_d0);
  ord_hash_set_t::~ord_hash_set_t(&local_a8);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

dfa_t::dfa_t(const nfa_t &nfa, const charset_t &charset, rules_t &rules)
	: states()
	, nchars(charset.size() - 1) // (n + 1) bounds for n ranges
{
	std::map<size_t, std::set<RuleOp*> > s2rules;
	ord_hash_set_t kernels;
	nfa_state_t **const buffer = new nfa_state_t*[nfa.size];
	std::vector<std::vector<nfa_state_t*> > arcs(nchars);

	find_state(buffer, closure(buffer, nfa.root), kernels);
	for (size_t i = 0; i < kernels.size(); ++i)
	{
		dfa_state_t *s = new dfa_state_t;
		states.push_back(s);

		nfa_state_t **kernel;
		const size_t kernel_size = kernels.deref<nfa_state_t*>(i, kernel);
		for (size_t j = 0; j < kernel_size; ++j)
		{
			nfa_state_t *n = kernel[j];
			switch (n->type)
			{
				case nfa_state_t::RAN:
				{
					nfa_state_t *m = n->value.ran.out;
					size_t c = 0;
					for (Range *r = n->value.ran.ran; r; r = r->next ())
					{
						for (; charset[c] != r->lower(); ++c);
						for (; charset[c] != r->upper(); ++c)
						{
							arcs[c].push_back(m);
						}
					}
					break;
				}
				case nfa_state_t::CTX:
					s->ctx = true;
					break;
				case nfa_state_t::FIN:
					s2rules[i].insert(n->value.fin.rule);
					break;
				default:
					break;
			}
		}

		s->arcs = new size_t[nchars];
		for(size_t c = 0; c < nchars; ++c)
		{
			nfa_state_t **end = buffer;
			for (std::vector<nfa_state_t*>::const_iterator j = arcs[c].begin(); j != arcs[c].end(); ++j)
			{
				end = closure(end, *j);
			}
			s->arcs[c] = find_state(buffer, end, kernels);
		}

		for(size_t c = 0; c < nchars; ++c)
		{
			arcs[c].clear();
		}
	}
	delete[] buffer;

	const size_t count = states.size();
	for (size_t i = 0; i < count; ++i)
	{
		dfa_state_t *s = states[i];
		std::set<RuleOp*> &rs = s2rules[i];
		// for each final state: choose the rule with the smallest rank
		for (std::set<RuleOp*>::const_iterator j = rs.begin(); j != rs.end(); ++j)
		{
			RuleOp *rule = *j;
			if (!s->rule || rule->rank < s->rule->rank)
			{
				s->rule = rule;
			}
		}
		// other rules are shadowed by the chosen rule
		for (std::set<RuleOp*>::const_iterator j = rs.begin(); j != rs.end(); ++j)
		{
			RuleOp *rule = *j;
			if (s->rule != rule)
			{
				rules[rule->rank].shadow.insert(s->rule->rank);
			}
		}
	}
}